

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O1

LispPTR COM_next_file(LispPTR *args)

{
  uint uVar1;
  uint uVar2;
  FINFO *pFVar3;
  FPROP *pFVar4;
  DLword *pDVar5;
  DLword *pDVar6;
  int iVar7;
  undefined4 uVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  
  iVar7 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar7 != 0) {
    *Lisp_errno = 100;
    return 0xfffff;
  }
  Lisp_errno = &Dummy_errno;
  uVar1 = *args;
  if ((uVar1 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
  }
  pDVar5 = Lisp_world;
  lVar10 = (long)*(int *)(Lisp_world + uVar1);
  if (lVar10 < 0) {
    return 0xfffff;
  }
  if (MAXFINFO <= *(int *)(Lisp_world + uVar1)) {
    return 0xfffff;
  }
  pFVar3 = FinfoArray[lVar10].next;
  if (pFVar3 == (FINFO *)0x0 || FinfoArray[lVar10].head == (FINFO *)0x0) {
    return 0xfffff;
  }
  iVar7 = *(int *)(Lisp_world + (ulong)uVar1 + 8);
  FinfoArray[lVar10].next = pFVar3->next;
  uVar2 = *(uint *)(pDVar5 + (ulong)uVar1 + 0xe);
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  pDVar6 = Lisp_world;
  sVar9 = pFVar3->lname_len;
  if (sVar9 != 0) {
    uVar2 = *(uint *)(Lisp_world + uVar2);
    uVar11 = 0;
    do {
      *(char *)((long)pDVar6 + uVar11 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3) = pFVar3->lname[uVar11];
      uVar11 = uVar11 + 1;
      sVar9 = pFVar3->lname_len;
    } while (uVar11 < sVar9);
  }
  if (iVar7 < 0) {
    pFVar4 = pFVar3->prop;
    *(uint *)(pDVar5 + (ulong)uVar1 + 0x10) = pFVar4->length;
    *(uint *)(pDVar5 + (ulong)uVar1 + 0x12) = pFVar4->wdate;
    *(uint *)(pDVar5 + (ulong)uVar1 + 0x14) = pFVar4->rdate;
    *(uint *)(pDVar5 + (ulong)uVar1 + 0x16) = pFVar4->protect;
    uVar2 = *(uint *)(pDVar5 + (ulong)uVar1 + 0x18);
    if ((uVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
    }
    pDVar6 = Lisp_world;
    uVar8 = (undefined4)pFVar4->au_len;
    if (pFVar4->au_len != 0) {
      uVar2 = *(uint *)(Lisp_world + uVar2);
      uVar11 = 0;
      do {
        *(char *)((long)pDVar6 + uVar11 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3) =
             pFVar4->author[uVar11];
        uVar11 = uVar11 + 1;
        uVar8 = (undefined4)pFVar4->au_len;
      } while (uVar11 < pFVar4->au_len);
    }
    *(undefined4 *)(pDVar5 + (ulong)uVar1 + 0x1a) = uVar8;
    uVar11 = pFVar3->lname_len;
    if (0xffff < uVar11) goto LAB_00118efc;
  }
  else {
    if (0xffff < sVar9) {
LAB_00118efc:
      error("Not Smallp data");
      return 0xe0000;
    }
    uVar11 = sVar9 & 0xffffffff;
  }
  return (uint)uVar11 | 0xe0000;
}

Assistant:

LispPTR COM_next_file(LispPTR *args)
{
  LispPTR laddr;
  FPROP *pp;
  FINFO *fp;
  char *base;
  DFINFO *dfp;
  UFSGFS *gfsp;
  int finfoid;
  unsigned propp;

  ERRSETJMP(SMALLP_MINUSONE);
  Lisp_errno = &Dummy_errno;

  gfsp = (UFSGFS *)(NativeAligned4FromLAddr(args[0]));

  finfoid = (int)gfsp->finfoid;

  if (finfoid < 0 || MAXFINFO - 1 < finfoid) return (SMALLP_MINUSONE);

  propp = gfsp->propp;

  dfp = &FinfoArray[finfoid];
  fp = dfp->next;
  if (dfp->head == NULL || fp == NULL) return (SMALLP_MINUSONE);
  dfp->next = fp->next;

  laddr = gfsp->name;
  STRING_BASE(laddr, base);
#ifndef BYTESWAP
  strncpy(base, fp->lname, fp->lname_len);
#else
  StrNCpyFromCToLisp(base, fp->lname, fp->lname_len);
#endif /* BYTESWAP	 */

  if (!propp) return (GetPosSmallp(fp->lname_len));

  pp = fp->prop;
  gfsp->length = pp->length;
  gfsp->wdate = pp->wdate;
  gfsp->rdate = pp->rdate;
  gfsp->protection = pp->protect;

  laddr = gfsp->author;
  STRING_BASE(laddr, base);
#ifndef BYTESWAP
  strncpy(base, pp->author, pp->au_len);
#else
  StrNCpyFromCToLisp(base, pp->author, pp->au_len);
#endif /* BYTESWAP	 */

  gfsp->aulen = pp->au_len;

  return (GetPosSmallp(fp->lname_len));
}